

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_countBackwardsMatch(BYTE *pIn,BYTE *pAnchor,BYTE *pMatch,BYTE *pBase)

{
  bool bVar1;
  size_t matchLength;
  BYTE *pBase_local;
  BYTE *pMatch_local;
  BYTE *pAnchor_local;
  BYTE *pIn_local;
  
  matchLength = 0;
  pMatch_local = pMatch;
  pIn_local = pIn;
  while( true ) {
    bVar1 = false;
    if ((pAnchor < pIn_local) && (bVar1 = false, pBase < pMatch_local)) {
      bVar1 = pIn_local[-1] == pMatch_local[-1];
    }
    if (!bVar1) break;
    pIn_local = pIn_local + -1;
    pMatch_local = pMatch_local + -1;
    matchLength = matchLength + 1;
  }
  return matchLength;
}

Assistant:

static size_t ZSTD_ldm_countBackwardsMatch(
            const BYTE* pIn, const BYTE* pAnchor,
            const BYTE* pMatch, const BYTE* pBase)
{
    size_t matchLength = 0;
    while (pIn > pAnchor && pMatch > pBase && pIn[-1] == pMatch[-1]) {
        pIn--;
        pMatch--;
        matchLength++;
    }
    return matchLength;
}